

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmac_prov.c
# Opt level: O0

void * gmac_dup(void *vsrc)

{
  int iVar1;
  long in_RDI;
  gmac_data_st *dst;
  gmac_data_st *src;
  PROV_CIPHER *in_stack_ffffffffffffffd8;
  void *local_8;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = gmac_new(in_stack_ffffffffffffffd8);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      iVar1 = EVP_CIPHER_CTX_copy(*(EVP_CIPHER_CTX **)((long)local_8 + 8),
                                  *(EVP_CIPHER_CTX **)(in_RDI + 8));
      if ((iVar1 == 0) ||
         (iVar1 = ossl_prov_cipher_copy(in_stack_ffffffffffffffd8,(PROV_CIPHER *)0x33b410),
         iVar1 == 0)) {
        gmac_free(local_8);
        local_8 = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static void *gmac_dup(void *vsrc)
{
    struct gmac_data_st *src = vsrc;
    struct gmac_data_st *dst;

    if (!ossl_prov_is_running())
        return NULL;

    dst = gmac_new(src->provctx);
    if (dst == NULL)
        return NULL;

    if (!EVP_CIPHER_CTX_copy(dst->ctx, src->ctx)
        || !ossl_prov_cipher_copy(&dst->cipher, &src->cipher)) {
        gmac_free(dst);
        return NULL;
    }
    return dst;
}